

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

TaskInfo * __thiscall
anon_unknown.dwarf_1fd0be::BuildEngineImpl::getTaskInfo(BuildEngineImpl *this,Task *task)

{
  bool bVar1;
  pointer ppVar2;
  TaskInfo *local_40;
  _Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
  local_30;
  _Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
  local_28;
  iterator it;
  lock_guard<std::mutex> guard;
  Task *task_local;
  BuildEngineImpl *this_local;
  
  guard._M_device = (mutex_type *)task;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->taskInfosMutex);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
       ::find(&this->taskInfos,(key_type *)&guard);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
       ::end(&this->taskInfos);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    local_40 = (TaskInfo *)0x0;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>
             ::operator->((_Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>
                           *)&local_28);
    local_40 = &ppVar2->second;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return local_40;
}

Assistant:

TaskInfo* getTaskInfo(Task* task) {
    std::lock_guard<std::mutex> guard(taskInfosMutex);
    auto it = taskInfos.find(task);
    return it == taskInfos.end() ? nullptr : &it->second;
  }